

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void jpgd::jpeg_decoder::decode_block_dc_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  int iVar1;
  int iVar2;
  coeff_buf *pcVar3;
  huff_tables *phVar4;
  uint8 *puVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint num_bits;
  ulong uVar9;
  
  pcVar3 = pD->m_dc_coeffs[component_id];
  iVar1 = pcVar3->block_num_x;
  if (((block_x < iVar1) && (block_y < pcVar3->block_num_y)) &&
     (phVar4 = pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]], phVar4 != (huff_tables *)0x0)) {
    puVar5 = pcVar3->pData;
    iVar2 = pcVar3->block_size;
    uVar7 = phVar4->look_up[pD->m_bit_buf >> 0x18];
    uVar9 = (ulong)(int)uVar7;
    if ((long)uVar9 < 0) {
      iVar8 = -8;
      do {
        uVar7 = -(uint)((pD->m_bit_buf >> (iVar8 + 0x1fU & 0x1f) & 1) != 0) - (int)uVar9;
        if (((int)(iVar8 + 0x1fU) < 0) || (0x1ff < uVar7)) goto LAB_0015065f;
        uVar7 = phVar4->tree[uVar7];
        uVar9 = (ulong)uVar7;
        iVar8 = iVar8 + -1;
      } while ((int)uVar7 < 0);
      num_bits = -iVar8;
    }
    else {
      if (0xff < uVar7) {
        __assert_fail("symbol < JPGD_HUFF_CODE_SIZE_MAX_LENGTH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                      ,0x207,"int jpgd::jpeg_decoder::huff_decode(huff_tables *)");
      }
      num_bits = (uint)phVar4->code_size[uVar9];
    }
    get_bits_no_markers(pD,num_bits);
    if (uVar7 == 0) {
      uVar6 = 0;
    }
    else {
      if (0xf < uVar7) goto LAB_0015065f;
      uVar6 = get_bits_no_markers(pD,uVar7);
      if ((int)uVar6 < *(int *)(s_extend_test + (ulong)uVar7 * 4)) {
        uVar6 = uVar6 + *(int *)(s_extend_offset + (ulong)uVar7 * 4);
      }
    }
    uVar6 = uVar6 + pD->m_last_dc_val[component_id];
    pD->m_last_dc_val[component_id] = uVar6;
    *(short *)(puVar5 + (long)(iVar1 * block_y * iVar2) + (long)(block_x * iVar2)) =
         (short)(uVar6 << ((byte)pD->m_successive_low & 0x1f));
    return;
  }
LAB_0015065f:
  stop_decoding(pD,JPGD_DECODE_ERROR);
}

Assistant:

void jpeg_decoder::decode_block_dc_first(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		int s, r;
		jpgd_block_t* p = pD->coeff_buf_getp(pD->m_dc_coeffs[component_id], block_x, block_y);

		if ((s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_dc_tab[component_id]])) != 0)
		{
			if (s >= 16)
				pD->stop_decoding(JPGD_DECODE_ERROR);

			r = pD->get_bits_no_markers(s);
			s = JPGD_HUFF_EXTEND(r, s);
		}

		pD->m_last_dc_val[component_id] = (s += pD->m_last_dc_val[component_id]);

		p[0] = static_cast<jpgd_block_t>(s << pD->m_successive_low);
	}